

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O0

void xmlBufDumpAttributeDecl(xmlBufPtr buf,xmlAttributePtr attr)

{
  xmlBufferPtr buf_00;
  xmlBufferPtr buffer;
  xmlAttributePtr attr_local;
  xmlBufPtr buf_local;
  
  buf_00 = xmlBufferCreate();
  if (buf_00 != (xmlBufferPtr)0x0) {
    xmlDumpAttributeDecl(buf_00,attr);
    xmlBufMergeBuffer(buf,buf_00);
  }
  return;
}

Assistant:

void
xmlBufDumpAttributeDecl(xmlBufPtr buf, xmlAttributePtr attr) {
    xmlBufferPtr buffer;

    buffer = xmlBufferCreate();
    if (buffer == NULL) {
        /*
         * TODO set the error in buf
         */
        return;
    }
    xmlDumpAttributeDecl(buffer, attr);
    xmlBufMergeBuffer(buf, buffer);
}